

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void breakstat(LexState *ls)

{
  FuncState *fs;
  byte bVar1;
  int l2;
  BlockCnt *pBVar2;
  
  fs = ls->fs;
  pBVar2 = fs->bl;
  if (pBVar2 != (BlockCnt *)0x0) {
    bVar1 = 0;
    do {
      if (pBVar2->isbreakable != '\0') {
        if (bVar1 != 0) {
          luaK_code(fs,(uint)pBVar2->nactvar << 6 | 0x23,fs->ls->lastline);
        }
        l2 = luaK_jump(fs);
        luaK_concat(fs,&pBVar2->breaklist,l2);
        return;
      }
      bVar1 = bVar1 | pBVar2->upval;
      pBVar2 = pBVar2->previous;
    } while (pBVar2 != (BlockCnt *)0x0);
  }
  luaX_lexerror(ls,"no loop to break",(ls->t).token);
}

Assistant:

static void breakstat(LexState*ls){
FuncState*fs=ls->fs;
BlockCnt*bl=fs->bl;
int upval=0;
while(bl&&!bl->isbreakable){
upval|=bl->upval;
bl=bl->previous;
}
if(!bl)
luaX_syntaxerror(ls,"no loop to break");
if(upval)
luaK_codeABC(fs,OP_CLOSE,bl->nactvar,0,0);
luaK_concat(fs,&bl->breaklist,luaK_jump(fs));
}